

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

JavascriptArray *
ByteCodeGenerator::BuildArrayFromStringList
          (ParseNode *stringNodeList,uint arrayLength,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *pJVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStr *pPVar6;
  JavascriptString *pJVar7;
  ulong uVar8;
  
  if (stringNodeList == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x252,"(stringNodeList)","stringNodeList");
    if (!bVar2) goto LAB_00756d15;
    *puVar3 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  pJVar4 = Js::JavascriptLibrary::CreateArray
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,arrayLength);
  uVar8 = 0;
  while( true ) {
    if (stringNodeList->nop != knopList) break;
    pPVar5 = ParseNode::AsParseNodeBin(stringNodeList);
    if (pPVar5->pnode1->nop != knopStr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x25b,"(stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr)",
                         "stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr");
      if (!bVar2) goto LAB_00756d15;
      *puVar3 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeBin(stringNodeList);
    pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
    pJVar7 = Js::JavascriptString::NewCopyBuffer
                       ((char16 *)&pPVar6->pid->field_0x22,pPVar6->pid->m_cch,scriptContext);
    (*(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pJVar4,uVar8,pJVar7,1);
    pPVar5 = ParseNode::AsParseNodeBin(stringNodeList);
    stringNodeList = pPVar5->pnode2;
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  if (stringNodeList->nop != knopStr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x265,"(stringNodeList->nop == knopStr)","stringNodeList->nop == knopStr");
    if (!bVar2) {
LAB_00756d15:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar6 = ParseNode::AsParseNodeStr(stringNodeList);
  pJVar7 = Js::JavascriptString::NewCopyBuffer
                     ((char16 *)&pPVar6->pid->field_0x22,pPVar6->pid->m_cch,scriptContext);
  (*(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pJVar4,uVar8,pJVar7,1);
  return pJVar4;
}

Assistant:

Js::JavascriptArray* ByteCodeGenerator::BuildArrayFromStringList(ParseNode* stringNodeList, uint arrayLength, Js::ScriptContext* scriptContext)
{
    Assert(stringNodeList);

    uint index = 0;
    Js::Var str;
    IdentPtr pid;
    Js::JavascriptArray* pArr = scriptContext->GetLibrary()->CreateArray(arrayLength);

    while (stringNodeList->nop == knopList)
    {
        Assert(stringNodeList->AsParseNodeBin()->pnode1->nop == knopStr);

        pid = stringNodeList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid;
        str = Js::JavascriptString::NewCopyBuffer(pid->Psz(), pid->Cch(), scriptContext);
        pArr->SetItemWithAttributes(index, str, PropertyEnumerable);

        stringNodeList = stringNodeList->AsParseNodeBin()->pnode2;
        index++;
    }

    Assert(stringNodeList->nop == knopStr);

    pid = stringNodeList->AsParseNodeStr()->pid;
    str = Js::JavascriptString::NewCopyBuffer(pid->Psz(), pid->Cch(), scriptContext);
    pArr->SetItemWithAttributes(index, str, PropertyEnumerable);

    return pArr;
}